

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

ssize_t ossl_recv(Curl_cfilter *cf,Curl_easy *data,char *buf,size_t buffersize,CURLcode *curlcode)

{
  uint err;
  void *pvVar1;
  connectdata *conn;
  long lVar2;
  int ret_code;
  int err_00;
  ulong error;
  uint *puVar3;
  char *pcVar4;
  size_t sVar5;
  ssize_t sVar6;
  char error_buffer [256];
  char local_138 [264];
  
  pvVar1 = cf->ctx;
  conn = cf->conn;
  lVar2 = *(long *)((long)pvVar1 + 0x30);
  ERR_clear_error();
  *(undefined4 *)((long)pvVar1 + 0x58) = 0;
  sVar5 = 0x7fffffff;
  if (buffersize < 0x7fffffff) {
    sVar5 = buffersize;
  }
  ret_code = SSL_read(*(SSL **)(lVar2 + 8),buf,(int)sVar5);
  sVar6 = (ssize_t)ret_code;
  if (0 < ret_code) {
    return sVar6;
  }
  err_00 = SSL_get_error(*(SSL **)(lVar2 + 8),ret_code);
  switch(err_00) {
  case 0:
    break;
  default:
    if (*(int *)(lVar2 + 0x20) == 0x51) goto switchD_0016a2e0_caseD_2;
    error = ERR_get_error();
    if (error == 0 && ret_code == 0) {
      return 0;
    }
    puVar3 = (uint *)__errno_location();
    err = *puVar3;
    if (error == 0) {
      if (err_00 == 5 && err != 0) {
        Curl_strerror(err,local_138,0x100);
      }
      else {
        pcVar4 = SSL_ERROR_to_str(err_00);
        curl_msnprintf(local_138,0x100,"%s",pcVar4);
      }
    }
    else {
      ossl_strerror(error,local_138,0x100);
    }
    Curl_failf(data,"OpenSSL SSL_read: %s, errno %d",local_138,(ulong)err);
    *curlcode = CURLE_RECV_ERROR;
    goto LAB_0016a314;
  case 3:
    *(undefined4 *)((long)pvVar1 + 0x58) = 2;
  case 2:
switchD_0016a2e0_caseD_2:
    *curlcode = CURLE_AGAIN;
LAB_0016a314:
    sVar6 = -1;
    break;
  case 6:
    if (cf->sockindex == 0) {
      Curl_conncontrol(conn,1);
    }
  }
  return sVar6;
}

Assistant:

static ssize_t ossl_recv(struct Curl_cfilter *cf,
                         struct Curl_easy *data,   /* transfer */
                         char *buf,                /* store read data here */
                         size_t buffersize,        /* max amount to read */
                         CURLcode *curlcode)
{
  char error_buffer[256];
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  struct connectdata *conn = cf->conn;
  struct ssl_connect_data *connssl = cf->ctx;
  struct ossl_ctx *octx = (struct ossl_ctx *)connssl->backend;

  (void)data;
  DEBUGASSERT(octx);

  ERR_clear_error();

  connssl->io_need = CURL_SSL_IO_NEED_NONE;
  buffsize = (buffersize > (size_t)INT_MAX) ? INT_MAX : (int)buffersize;
  nread = (ssize_t)SSL_read(octx->ssl, buf, buffsize);

  if(nread <= 0) {
    /* failed SSL_read */
    int err = SSL_get_error(octx->ssl, (int)nread);

    switch(err) {
    case SSL_ERROR_NONE: /* this is not an error */
      break;
    case SSL_ERROR_ZERO_RETURN: /* no more data */
      /* close_notify alert */
      if(cf->sockindex == FIRSTSOCKET)
        /* mark the connection for close if it is indeed the control
           connection */
        connclose(conn, "TLS close_notify");
      break;
    case SSL_ERROR_WANT_READ:
      *curlcode = CURLE_AGAIN;
      nread = -1;
      goto out;
    case SSL_ERROR_WANT_WRITE:
      connssl->io_need = CURL_SSL_IO_NEED_SEND;
      *curlcode = CURLE_AGAIN;
      nread = -1;
      goto out;
    default:
      /* openssl/ssl.h for SSL_ERROR_SYSCALL says "look at error stack/return
         value/errno" */
      /* https://docs.openssl.org/master/man3/ERR_get_error/ */
      if(octx->io_result == CURLE_AGAIN) {
        *curlcode = CURLE_AGAIN;
        nread = -1;
        goto out;
      }
      sslerror = ERR_get_error();
      if((nread < 0) || sslerror) {
        /* If the return code was negative or there actually is an error in the
           queue */
        int sockerr = SOCKERRNO;
        if(sslerror)
          ossl_strerror(sslerror, error_buffer, sizeof(error_buffer));
        else if(sockerr && err == SSL_ERROR_SYSCALL)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else
          msnprintf(error_buffer, sizeof(error_buffer), "%s",
                    SSL_ERROR_to_str(err));
        failf(data, OSSL_PACKAGE " SSL_read: %s, errno %d",
              error_buffer, sockerr);
        *curlcode = CURLE_RECV_ERROR;
        nread = -1;
        goto out;
      }
      /* For debug builds be a little stricter and error on any
         SSL_ERROR_SYSCALL. For example a server may have closed the connection
         abruptly without a close_notify alert. For compatibility with older
         peers we do not do this by default. #4624

         We can use this to gauge how many users may be affected, and
         if it goes ok eventually transition to allow in dev and release with
         the newest OpenSSL: #if (OPENSSL_VERSION_NUMBER >= 0x10101000L) */
#ifdef DEBUGBUILD
      if(err == SSL_ERROR_SYSCALL) {
        int sockerr = SOCKERRNO;
        if(sockerr)
          Curl_strerror(sockerr, error_buffer, sizeof(error_buffer));
        else {
          msnprintf(error_buffer, sizeof(error_buffer),
                    "Connection closed abruptly");
        }
        failf(data, OSSL_PACKAGE " SSL_read: %s, errno %d"
              " (Fatal because this is a curl debug build)",
              error_buffer, sockerr);
        *curlcode = CURLE_RECV_ERROR;
        nread = -1;
        goto out;
      }
#endif
    }
  }

out:
  return nread;
}